

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O2

obj * oname(obj *obj,char *name)

{
  bool bVar1;
  boolean bVar2;
  size_t sVar3;
  uint oname_size;
  char buf [63];
  
  if (*name == '\0') {
    if (obj->oartifact != '\0') {
      return obj;
    }
LAB_00179acb:
    if (obj->onamelth == '\0') goto LAB_00179b0d;
    bVar1 = true;
    oname_size = 0;
LAB_00179ae1:
    obj = realloc_obj(obj,(int)obj->oxlth,obj->oextra,oname_size,name);
    if (bVar1) goto LAB_00179b0d;
  }
  else {
    sVar3 = strlen(name);
    oname_size = (int)sVar3 + 1;
    if ((int)oname_size < 0x40) {
      if (obj->oartifact != '\0') {
        return obj;
      }
      if (oname_size == 0) goto LAB_00179acb;
    }
    else {
      strncpy(buf,name,0x3e);
      buf[0x3e] = '\0';
      if (obj->oartifact != '\0') {
        return obj;
      }
      oname_size = 0x3f;
      name = buf;
    }
    bVar2 = exist_artifact((int)obj->otyp,name);
    if (bVar2 != '\0') {
      return obj;
    }
    if (oname_size != obj->onamelth) {
      bVar1 = false;
      goto LAB_00179ae1;
    }
    strcpy((char *)((long)obj->oextra + (long)obj->oxlth),name);
  }
  artifact_exists(obj,name,'\x01');
LAB_00179b0d:
  if (obj->oartifact != '\0') {
    if (obj == uswapwep) {
      untwoweapon();
    }
    if (obj == uwep) {
      set_artifact_intrinsic(obj,'\x01',0x100,'\x01');
    }
    if ((obj->oartifact == '\x1a') && (obj->owt = 300, urole.malenum == 0x15d)) {
      obj->field_0x4b = obj->field_0x4b | 0x10;
    }
  }
  if (obj->where == '\x03') {
    update_inventory();
  }
  return obj;
}

Assistant:

struct obj *oname(struct obj *obj, const char *name)
{
	int lth;
	char buf[PL_PSIZ];

	lth = *name ? (int)(strlen(name) + 1) : 0;
	if (lth > PL_PSIZ) {
		lth = PL_PSIZ;
		name = strncpy(buf, name, PL_PSIZ - 1);
		buf[PL_PSIZ - 1] = '\0';
	}
	/* If named artifact exists in the game, do not create another.
	 * Also trying to create an artifact shouldn't de-artifact
	 * it (e.g. Excalibur from prayer). In this case the object
	 * will retain its current name. */
	if (obj->oartifact || (lth && exist_artifact(obj->otyp, name)))
		return obj;

	if (lth == obj->onamelth) {
		/* no need to replace entire object */
		if (lth) strcpy(ONAME(obj), name);
	} else {
		obj = realloc_obj(obj, obj->oxlth,
			      obj->oextra, lth, name);
	}
	if (lth) artifact_exists(obj, name, TRUE);
	if (obj->oartifact) {
	    /* can't dual-wield with artifact as secondary weapon */
	    if (obj == uswapwep) untwoweapon();
	    /* activate warning if you've just named your weapon "Sting" */
	    if (obj == uwep) set_artifact_intrinsic(obj, TRUE, W_WEP, TRUE);
	    /* The Iron Ball of Liberation is rustproof only for convicts. */
	    if (obj->oartifact == ART_IRON_BALL_OF_LIBERATION) {
		obj->owt = 300;	/* magically lightened, but still heavy */
		if (Role_if(PM_CONVICT)) obj->oerodeproof = TRUE;
	    }
	}
	if (carried(obj)) update_inventory();
	return obj;
}